

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
          (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *this,
          Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *other)

{
  bool bVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1.value.buffer.ptr = (other->ptr).field_1.value.buffer.ptr;
    (this->ptr).field_1.value.buffer.size_ = (other->ptr).field_1.value.buffer.size_;
    (this->ptr).field_1.value.buffer.disposer = (other->ptr).field_1.value.buffer.disposer;
    (other->ptr).field_1.value.buffer.ptr = (uchar *)0x0;
    (other->ptr).field_1.value.buffer.size_ = 0;
    sVar3 = (other->ptr).field_1.value.leftover.size_;
    (this->ptr).field_1.value.leftover.ptr = (other->ptr).field_1.value.leftover.ptr;
    (this->ptr).field_1.value.leftover.size_ = sVar3;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    puVar2 = (other->ptr).field_1.value.buffer.ptr;
    if (puVar2 != (uchar *)0x0) {
      sVar3 = (other->ptr).field_1.value.buffer.size_;
      (other->ptr).field_1.value.buffer.ptr = (uchar *)0x0;
      (other->ptr).field_1.value.buffer.size_ = 0;
      pAVar4 = (other->ptr).field_1.value.buffer.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,1,sVar3,sVar3,0);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }